

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O0

void __thiscall
PartsBupOutputter::newMouth
          (PartsBupOutputter *this,Image *img,Point pos,int num,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Blend BVar2;
  ulong uVar3;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  path *this_00;
  path *filename;
  Image *this_01;
  char *in_stack_fffffffffffffeb0;
  path *__rhs;
  path *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffedc;
  path local_110;
  Image *in_stack_ffffffffffffff30;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_ffffffffffffff38;
  Image *in_stack_ffffffffffffff40;
  PartsBupOutputter *in_stack_ffffffffffffff48;
  Point in_stack_ffffffffffffff50;
  string local_88 [32];
  string local_68 [32];
  path local_48;
  undefined8 local_8;
  
  local_8 = in_RDX;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pbVar1 = in_RDI + 3;
  }
  else {
    pbVar1 = in_RDI + 2;
  }
  __lhs = (path *)((long)&pbVar1->field_2 + 8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 in_stack_fffffffffffffeb0);
  std::__cxx11::to_string(in_stack_fffffffffffffedc);
  std::operator+(in_stack_fffffffffffffec8,in_RDI);
  filename = (path *)(in_RDI[4].field_2._M_local_buf + 8);
  this_00 = &local_48;
  std::__cxx11::string::operator=((string *)filename,(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  *(undefined8 *)(in_RDI + 6) = local_8;
  BVar2 = prepareImageInTmp(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                            in_stack_ffffffffffffff50,in_stack_ffffffffffffff38,
                            in_stack_ffffffffffffff30);
  *(Blend *)((long)&in_RDI[9]._M_string_length + 4) = BVar2;
  this_01 = (Image *)&in_RDI[8]._M_string_length;
  __rhs = &local_110;
  std::operator+(&__lhs->_M_pathname,(char *)__rhs);
  std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
            (in_stack_fffffffffffffe88);
  std::filesystem::__cxx11::operator/(__lhs,__rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,(allocator<char> *)in_RDI);
  Image::writePNG(this_01,filename,&this_00->_M_pathname);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffecf);
  std::filesystem::__cxx11::path::~path(this_00);
  std::filesystem::__cxx11::path::~path(this_00);
  std::__cxx11::string::~string((string *)&local_110);
  return;
}

Assistant:

void newMouth(const Image& img, Point pos, int num, const std::vector<MaskRect>& mask) override {
		withMouthName = (withFaceName.empty() ? baseName : withFaceName) + "_" + std::to_string(num);
		mouthPos = pos;
		mouthBlend = prepareImageInTmp(img, pos, mask, withFace);
		tmp.writePNG(partsPath/fs::u8path(withMouthName + ".png"));
	}